

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

bool __thiscall Network::Socket::BerkeleyPool::isConnected(BerkeleyPool *this,TimeOut *timeout)

{
  int iVar1;
  ulong uVar2;
  
  if (this->size != 0) {
    uVar2 = 0;
    do {
      (*(this->pool[uVar2]->super_BaseSocket)._vptr_BaseSocket[0x13])(this->pool[uVar2],1,0);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->size);
  }
  iVar1 = (*(this->super_MonitoringPool)._vptr_MonitoringPool[5])(this,timeout);
  if (this->size != 0) {
    uVar2 = 0;
    do {
      (*(this->pool[uVar2]->super_BaseSocket)._vptr_BaseSocket[0x13])(this->pool[uVar2],1,1);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->size);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool BerkeleyPool::isConnected(const Time::TimeOut & timeout)
        {
            for (uint32 i = 0; i < size; i++) pool[i]->setOption(BaseSocket::Blocking, 0);
            bool ret = isReadPossible(timeout);
            for (uint32 j = 0; j < size; j++) pool[j]->setOption(BaseSocket::Blocking, 1);
            return ret;
        }